

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator+=(TPZFMatrix<long_double> *this,TPZMatrix<long_double> *aBase)

{
  longdouble lVar1;
  long lVar2;
  long lVar3;
  longdouble *plVar4;
  long lVar5;
  longdouble *plVar6;
  longdouble *plVar7;
  
  lVar2 = __dynamic_cast(aBase,&TPZMatrix<long_double>::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    Error("TPZFMatrix<TVar> &TPZFMatrix<long double>::operator+=(const TPZMatrix<TVar> &) [TVar = long double]"
          ," incompatible argument");
  }
  lVar5 = *(long *)(lVar2 + 8);
  if ((lVar5 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) ||
     (lVar3 = *(long *)(lVar2 + 0x10),
     lVar3 != (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol)) {
    Error("Operator+= <matrices with different dimensions>",(char *)0x0);
    lVar5 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    lVar3 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  }
  if (0 < lVar3 * lVar5) {
    plVar6 = this->fElem;
    plVar4 = plVar6 + lVar3 * lVar5;
    plVar7 = *(longdouble **)(lVar2 + 0x20);
    do {
      lVar1 = *plVar7;
      plVar7 = plVar7 + 1;
      *plVar6 = *plVar6 + lVar1;
      plVar6 = plVar6 + 1;
    } while (plVar6 < plVar4);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> & TPZFMatrix<TVar>::operator+=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator+= <matrices with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem, *pmlast=pm+size;
    TVar * pa = A->fElem;
    while(pm < pmlast) (*pm++) += (*pa++);
    return( *this );
}